

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Heuristics.cpp
# Opt level: O0

Table * __thiscall
Heuristics::popFromFrontierBestFirst(Table *__return_storage_ptr__,Heuristics *this)

{
  bool bVar1;
  reference pTVar2;
  __normal_iterator<Table_*,_std::vector<Table,_std::allocator<Table>_>_> local_68;
  __normal_iterator<Table_*,_std::vector<Table,_std::allocator<Table>_>_> local_60;
  const_iterator local_58;
  undefined8 local_50;
  Table table;
  iterator __end1;
  iterator __begin1;
  vector<Table,_std::allocator<Table>_> *__range1;
  int local_18;
  int position;
  int positionOfBest;
  int score;
  Heuristics *this_local;
  
  Table::Table(__return_storage_ptr__);
  position = 1000;
  __range1._4_4_ = 0;
  __end1 = std::vector<Table,_std::allocator<Table>_>::begin(&this->evaluatedChildren);
  table._16_8_ = std::vector<Table,_std::allocator<Table>_>::end(&this->evaluatedChildren);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<Table_*,_std::vector<Table,_std::allocator<Table>_>_>
                                *)&table.current_col);
    if (!bVar1) break;
    pTVar2 = __gnu_cxx::__normal_iterator<Table_*,_std::vector<Table,_std::allocator<Table>_>_>::
             operator*(&__end1);
    local_50 = *(undefined8 *)pTVar2->table;
    table.table._0_8_ = *(undefined8 *)(pTVar2->table[2] + 2);
    table._8_8_ = *(undefined8 *)&pTVar2->current_col;
    if (table.current_row <= position) {
      position = table.current_row;
      local_18 = __range1._4_4_;
      *(undefined8 *)__return_storage_ptr__->table = local_50;
      *(undefined8 *)(__return_storage_ptr__->table[2] + 2) = table.table._0_8_;
      *(undefined8 *)&__return_storage_ptr__->current_col = table._8_8_;
    }
    __range1._4_4_ = __range1._4_4_ + 1;
    __gnu_cxx::__normal_iterator<Table_*,_std::vector<Table,_std::allocator<Table>_>_>::operator++
              (&__end1);
  }
  local_68._M_current =
       (Table *)std::vector<Table,_std::allocator<Table>_>::begin(&this->evaluatedChildren);
  local_60 = __gnu_cxx::__normal_iterator<Table_*,_std::vector<Table,_std::allocator<Table>_>_>::
             operator+(&local_68,(long)local_18);
  __gnu_cxx::__normal_iterator<Table_const*,std::vector<Table,std::allocator<Table>>>::
  __normal_iterator<Table*>
            ((__normal_iterator<Table_const*,std::vector<Table,std::allocator<Table>>> *)&local_58,
             &local_60);
  std::vector<Table,_std::allocator<Table>_>::erase(&this->evaluatedChildren,local_58);
  return __return_storage_ptr__;
}

Assistant:

Table Heuristics::popFromFrontierBestFirst() {
    Table bestNextState;
    int score = 1000;
    int positionOfBest;
    int position = 0;
    for (Table table : evaluatedChildren) {
        if (table.evaluationScore <= score) {
            score = table.evaluationScore;
            positionOfBest = position;
            bestNextState = table;
        }
        position++;
    }
    evaluatedChildren.erase(evaluatedChildren.begin()+positionOfBest);
    return bestNextState;
}